

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O0

qint64 __thiscall
QUdpSocket::readDatagram
          (QUdpSocket *this,char *data,qint64 maxSize,QHostAddress *address,quint16 *port)

{
  QAbstractSocketEngine *pQVar1;
  bool bVar2;
  SocketError errorCode;
  QAbstractSocketPrivate *this_00;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined2 *in_R8;
  long in_FS_OFFSET;
  qint64 readBytes;
  QUdpSocketPrivate *d;
  QIpPacketHeader header;
  QHostAddress *in_stack_fffffffffffffed8;
  int n;
  QIpPacketHeader *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  SocketError in_stack_fffffffffffffeec;
  QAbstractSocketPrivate *in_stack_fffffffffffffef0;
  long local_d0;
  qint64 local_98;
  undefined4 local_60;
  undefined4 local_5c;
  char local_50 [32];
  undefined1 local_30 [28];
  undefined2 local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &d_func((QUdpSocket *)0x26735d)->super_QAbstractSocketPrivate;
  bVar2 = QAbstractSocket::isValid((QAbstractSocket *)in_stack_fffffffffffffee0);
  if (bVar2) {
    if ((in_RCX == 0) && (in_R8 == (undefined2 *)0x0)) {
      pQVar1 = this_00->socketEngine;
      QFlags<QAbstractSocketEngine::PacketHeaderOption>::QFlags
                ((QFlags<QAbstractSocketEngine::PacketHeaderOption> *)in_stack_fffffffffffffee0,
                 (PacketHeaderOption)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      n = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      local_d0 = (**(code **)(*(long *)pQVar1 + 0xf8))(pQVar1,in_RSI,in_RDX,0,local_60);
    }
    else {
      memset(local_30,0xaa,0x28);
      QHostAddress::QHostAddress(&in_stack_fffffffffffffee0->senderAddress);
      QIpPacketHeader::QIpPacketHeader
                ((QIpPacketHeader *)in_stack_fffffffffffffef0,
                 (QHostAddress *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (quint16)((ulong)in_stack_fffffffffffffee0 >> 0x30));
      QHostAddress::~QHostAddress((QHostAddress *)0x26741a);
      pQVar1 = this_00->socketEngine;
      QFlags<QAbstractSocketEngine::PacketHeaderOption>::QFlags
                ((QFlags<QAbstractSocketEngine::PacketHeaderOption> *)in_stack_fffffffffffffee0,
                 (PacketHeaderOption)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      local_d0 = (**(code **)(*(long *)pQVar1 + 0xf8))(pQVar1,in_RSI,in_RDX,local_30,local_5c);
      if (in_RCX != 0) {
        QHostAddress::operator=(&in_stack_fffffffffffffee0->senderAddress,in_stack_fffffffffffffed8)
        ;
      }
      n = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      if (in_R8 != (undefined2 *)0x0) {
        *in_R8 = local_14;
      }
      QIpPacketHeader::~QIpPacketHeader(in_stack_fffffffffffffee0);
    }
    this_00->hasPendingData = false;
    this_00->hasPendingDatagram = false;
    (**(code **)(*(long *)this_00->socketEngine + 0x140))(this_00->socketEngine,1);
    if (local_d0 < 0) {
      if (local_d0 == -2) {
        tr((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
           (char *)in_stack_fffffffffffffee0,n);
        QAbstractSocketPrivate::setErrorAndEmit
                  (this_00,in_stack_fffffffffffffeec,(QString *)in_stack_fffffffffffffee0);
        QString::~QString((QString *)0x2675b1);
        local_98 = -1;
        goto LAB_00267627;
      }
      errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x2675da);
      QAbstractSocketEngine::errorString
                ((QAbstractSocketEngine *)CONCAT44(errorCode,in_stack_fffffffffffffee8));
      QAbstractSocketPrivate::setErrorAndEmit
                (in_stack_fffffffffffffef0,errorCode,(QString *)this_00);
      QString::~QString((QString *)0x26761a);
    }
    local_98 = local_d0;
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffef0,
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),(char *)in_stack_fffffffffffffed8);
    QMessageLogger::warning
              (local_50,
               "QUdpSocket::readDatagram() called on a QUdpSocket when not in QUdpSocket::BoundState"
              );
    local_98 = -1;
  }
LAB_00267627:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_98;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QUdpSocket::readDatagram(char *data, qint64 maxSize, QHostAddress *address,
                                    quint16 *port)
{
    Q_D(QUdpSocket);

#if defined QUDPSOCKET_DEBUG
    qDebug("QUdpSocket::readDatagram(%p, %llu, %p, %p)", data, maxSize, address, port);
#endif
    QT_CHECK_BOUND("QUdpSocket::readDatagram()", -1);

    qint64 readBytes;
    if (address || port) {
        QIpPacketHeader header;
        readBytes = d->socketEngine->readDatagram(data, maxSize, &header,
                                                  QAbstractSocketEngine::WantDatagramSender);
        if (address)
            *address = header.senderAddress;
        if (port)
            *port = header.senderPort;
    } else {
        readBytes = d->socketEngine->readDatagram(data, maxSize);
    }

    d->hasPendingData = false;
    d->hasPendingDatagram = false;
    d->socketEngine->setReadNotificationEnabled(true);
    if (readBytes < 0) {
        if (readBytes == -2) {
            // No pending datagram. Treat as a temporary error.
            d->setErrorAndEmit(QAbstractSocket::TemporaryError,
                               tr("No datagram available for reading"));
            return -1;
        }
        d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
    }
    return readBytes;
}